

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3ColumnColl(Column *pCol)

{
  char *z;
  Column *pCol_local;
  char *local_8;
  
  if ((pCol->colFlags & 0x200) == 0) {
    local_8 = (char *)0x0;
  }
  else {
    for (z = pCol->zCnName; *z != '\0'; z = z + 1) {
    }
    if ((pCol->colFlags & 4) != 0) {
      do {
        z = z + 1;
      } while (*z != '\0');
    }
    local_8 = z + 1;
  }
  return local_8;
}

Assistant:

SQLITE_PRIVATE const char *sqlite3ColumnColl(Column *pCol){
  const char *z;
  if( (pCol->colFlags & COLFLAG_HASCOLL)==0 ) return 0;
  z = pCol->zCnName;
  while( *z ){ z++; }
  if( pCol->colFlags & COLFLAG_HASTYPE ){
    do{ z++; }while( *z );
  }
  return z+1;
}